

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepInnerStepper_GetForcingData
              (MRIStepInnerStepper stepper,sunrealtype *tshift,sunrealtype *tscale,
              N_Vector **forcing,int *nforcing)

{
  int iVar1;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    iVar1 = -0x16;
    arkProcessError((ARKodeMem)0x0,-0x16,0x1194,"MRIStepInnerStepper_GetForcingData",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Inner stepper memory is NULL");
  }
  else {
    *tshift = stepper->tshift;
    *tscale = stepper->tscale;
    *forcing = stepper->forcing;
    *nforcing = stepper->nforcing;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MRIStepInnerStepper_GetForcingData(MRIStepInnerStepper stepper,
                                       sunrealtype* tshift, sunrealtype* tscale,
                                       N_Vector** forcing, int* nforcing)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  *tshift   = stepper->tshift;
  *tscale   = stepper->tscale;
  *forcing  = stepper->forcing;
  *nforcing = stepper->nforcing;

  return ARK_SUCCESS;
}